

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::removeUnusedMaterials(Geometry *this)

{
  MeshHeader *this_00;
  int32 iVar1;
  Mesh *pMVar2;
  void *pvVar3;
  Material **ppMVar4;
  MeshHeader *this_01;
  int local_64;
  uint local_60;
  int32 i_5;
  uint32 i_4;
  uint32 i_3;
  Mesh *newm;
  MeshHeader *newmh;
  int32 i_2;
  int32 oldid;
  uint32 i_1;
  int32 numMaterials;
  Material **materials;
  int32 *map;
  uint32 i;
  Mesh *m;
  MeshHeader *mh;
  Geometry *this_local;
  
  if (this->meshHeader != (MeshHeader *)0x0) {
    this_00 = this->meshHeader;
    pMVar2 = MeshHeader::getMeshes(this_00);
    for (map._4_4_ = 0; map._4_4_ < this_00->numMeshes; map._4_4_ = map._4_4_ + 1) {
      if (pMVar2[map._4_4_].indices == (uint16 *)0x0) {
        return;
      }
    }
    pvVar3 = mustmalloc_LOC((long)(this->matList).numMaterials << 2,0x1000f,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 635"
                           );
    ppMVar4 = (Material **)
              mustmalloc_LOC((long)(this->matList).numMaterials << 3,0x30007,
                             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 637"
                            );
    oldid = 0;
    for (i_2 = 0; (uint)i_2 < (uint)this_00->numMeshes; i_2 = i_2 + 1) {
      if (pMVar2[(uint)i_2].numIndices != 0) {
        ppMVar4[oldid] = pMVar2[(uint)i_2].material;
        Material::addRef(pMVar2[(uint)i_2].material);
        iVar1 = MaterialList::findIndex(&this->matList,pMVar2[(uint)i_2].material);
        *(int32 *)((long)pvVar3 + (long)iVar1 * 4) = oldid;
        oldid = oldid + 1;
      }
    }
    for (newmh._0_4_ = 0; (int)newmh < (this->matList).numMaterials; newmh._0_4_ = (int)newmh + 1) {
      Material::destroy((this->matList).materials[(int)newmh]);
    }
    (*DAT_001685f8)((this->matList).materials);
    (this->matList).materials = ppMVar4;
    (this->matList).space = (this->matList).numMaterials;
    (this->matList).numMaterials = oldid;
    this->meshHeader = (MeshHeader *)0x0;
    this_01 = allocateMeshes(this,oldid,this_00->totalIndices,0);
    this_01->flags = this_00->flags;
    _i_4 = MeshHeader::getMeshes(this_01);
    for (i_5 = 0; (uint)i_5 < (uint)this_00->numMeshes; i_5 = i_5 + 1) {
      if (pMVar2[(uint)i_5].numIndices != 0) {
        _i_4->numIndices = pMVar2[(uint)i_5].numIndices;
        _i_4->material = pMVar2[(uint)i_5].material;
        _i_4 = _i_4 + 1;
      }
    }
    MeshHeader::setupIndices(this_01);
    _i_4 = MeshHeader::getMeshes(this_01);
    for (local_60 = 0; local_60 < this_00->numMeshes; local_60 = local_60 + 1) {
      if (pMVar2[local_60].numIndices != 0) {
        memcpy(_i_4->indices,pMVar2[local_60].indices,(ulong)pMVar2[local_60].numIndices << 1);
        _i_4 = _i_4 + 1;
      }
    }
    (*DAT_001685f8)(this_00);
    for (local_64 = 0; local_64 < this->numTriangles; local_64 = local_64 + 1) {
      this->triangles[local_64].matId =
           (uint16)*(undefined4 *)((long)pvVar3 + (ulong)this->triangles[local_64].matId * 4);
    }
    (*DAT_001685f8)(pvVar3);
  }
  return;
}

Assistant:

void
Geometry::removeUnusedMaterials(void)
{
	if(this->meshHeader == nil)
		return;
	MeshHeader *mh = this->meshHeader;
	Mesh *m = mh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++)
		if(m[i].indices == nil)
			return;

	int32 *map = rwNewT(int32, this->matList.numMaterials,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	Material **materials = rwNewT(Material*,this->matList.numMaterials,
		MEMDUR_EVENT | ID_MATERIAL);
	int32 numMaterials = 0;
	/* Build new material list and map */
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		materials[numMaterials] = m[i].material;
		m[i].material->addRef();
		int32 oldid = this->matList.findIndex(m[i].material);
		map[oldid] = numMaterials;
		numMaterials++;
	}
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		this->matList.materials[i]->destroy();
	rwFree(this->matList.materials);
	this->matList.materials = materials;
	this->matList.space = this->matList.numMaterials;
	this->matList.numMaterials = numMaterials;

	/* Build new meshes */
	this->meshHeader = nil;
	MeshHeader *newmh = this->allocateMeshes(numMaterials, mh->totalIndices, 0);
	newmh->flags = mh->flags;
	Mesh *newm = newmh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		newm->numIndices = m[i].numIndices;
		newm->material = m[i].material;
		newm++;
	}
	newmh->setupIndices();
	/* Copy indices */
	newm = newmh->getMeshes();;
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		memcpy(newm->indices, m[i].indices,
		       m[i].numIndices*sizeof(*m[i].indices));
		newm++;
	}
	rwFree(mh);

	/* Remap triangle material IDs */
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = map[this->triangles[i].matId];
	rwFree(map);
}